

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recovery_test.cc
# Opt level: O3

void __thiscall
leveldb::RecoveryTest_ManifestMissing_Test::TestBody(RecoveryTest_ManifestMissing_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  DB *pDVar2;
  PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> PVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  char *message;
  char *in_R9;
  Status status;
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  undefined8 uStack_80;
  char local_78 [16];
  AssertHelper local_68;
  Message local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"foo","");
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"bar","");
  local_98._0_8_ = local_50._M_dataplus._M_p;
  local_98._8_8_ = local_50._M_string_length;
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_88._M_p._0_4_;
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = local_88._M_p._4_4_;
  uStack_58 = (undefined4)uStack_80;
  uStack_54 = uStack_80._4_4_;
  (*((this->super_RecoveryTest).db_)->_vptr_DB[2])(&local_68);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)local_98,(char *)&local_60
             ,(Status *)"Put(\"foo\", \"bar\")");
  if (local_68.data_ != (AssertHelperData *)0x0) {
    operator_delete__(local_68.data_);
  }
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  PVar3 = local_98[0];
  if (local_98[0] == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )local_98._8_8_ ==
        (__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)local_98._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
               ,0x146,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_50._M_dataplus._M_p + 8))();
    }
  }
  uVar4 = local_98._8_8_;
  if ((GTestFlagSaver *)local_98._8_8_ != (GTestFlagSaver *)0x0) {
    if (*(undefined8 **)local_98._8_8_ != (size_type *)(local_98._8_8_ + 0x10)) {
      operator_delete(*(undefined8 **)local_98._8_8_);
    }
    operator_delete((void *)uVar4);
  }
  if (PVar3 == (PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>)0x0) {
    return;
  }
  pDVar2 = (this->super_RecoveryTest).db_;
  if (pDVar2 != (DB *)0x0) {
    (*pDVar2->_vptr_DB[1])();
  }
  (this->super_RecoveryTest).db_ = (DB *)0x0;
  RecoveryTest::RemoveManifestFile(&this->super_RecoveryTest);
  RecoveryTest::OpenWithStatus((RecoveryTest *)local_98,(Options *)this);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    local_88._M_p = (pointer)((ulong)local_88._M_p._1_7_ << 8);
  }
  else {
    local_88._M_p._0_1_ = *(char *)(local_98._0_8_ + 4) == '\x02';
    uStack_80 = (undefined8 *)0x0;
    if (*(char *)(local_98._0_8_ + 4) == '\x02') goto LAB_0010e8f5;
  }
  uStack_80 = (undefined8 *)0x0;
  testing::Message::Message(&local_60);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_50,(internal *)&local_88,(AssertionResult *)"status.IsCorruption()","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            (&local_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/recovery_test.cc"
             ,0x14b,local_50._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_68,&local_60);
  testing::internal::AssertHelper::~AssertHelper(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((long *)CONCAT44(local_60.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       local_60.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   local_60.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._0_4_) + 8))();
  }
  puVar5 = uStack_80;
  if (uStack_80 != (undefined8 *)0x0) {
    if ((undefined8 *)*uStack_80 != uStack_80 + 2) {
      operator_delete((undefined8 *)*uStack_80);
    }
    operator_delete(puVar5);
  }
LAB_0010e8f5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._0_8_ !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete__((void *)local_98._0_8_);
  }
  return;
}

Assistant:

TEST_F(RecoveryTest, ManifestMissing) {
  ASSERT_LEVELDB_OK(Put("foo", "bar"));
  Close();
  RemoveManifestFile();

  Status status = OpenWithStatus();
  ASSERT_TRUE(status.IsCorruption());
}